

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O0

bool __thiscall Potassco::AspifTextInput::parseStatements(AspifTextInput *this)

{
  long in_RDI;
  bool in_stack_0000000f;
  char *in_stack_00000010;
  AspifTextInput *in_stack_00000018;
  char c;
  Data data;
  AspifTextInput *in_stack_00000098;
  undefined1 in_stack_ffffffffffffff9f;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  char in_stack_ffffffffffffffa7;
  char in_stack_ffffffffffffffbf;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 local_38 [56];
  
  ProgramReader::require
            ((ProgramReader *)
             CONCAT17(in_stack_ffffffffffffffa7,
                      CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
             (bool)in_stack_ffffffffffffff9f,(char *)0x10e52d);
  Data::Data((Data *)CONCAT17(in_stack_ffffffffffffffa7,
                              CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  *(undefined1 **)(in_RDI + 0x20) = local_38;
  while (in_stack_ffffffffffffffa7 =
              ProgramReader::peek((ProgramReader *)
                                  CONCAT17(in_stack_ffffffffffffffa7,
                                           CONCAT16(in_stack_ffffffffffffffa6,
                                                    in_stack_ffffffffffffffa0)),
                                  (bool)in_stack_ffffffffffffff9f),
        in_stack_ffffffffffffffa7 != '\0') {
    if (in_stack_ffffffffffffffa7 == '.') {
      match(in_stack_00000018,in_stack_00000010,in_stack_0000000f);
    }
    else if (in_stack_ffffffffffffffa7 == '#') {
      in_stack_ffffffffffffffa6 = matchDirective(in_stack_00000098);
      if (!(bool)in_stack_ffffffffffffffa6) break;
    }
    else if (in_stack_ffffffffffffffa7 == '%') {
      ProgramReader::skipLine
                ((ProgramReader *)
                 CONCAT17(0x25,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
    }
    else {
      matchRule((AspifTextInput *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbf);
    }
    Data::clear((Data *)CONCAT17(in_stack_ffffffffffffffa7,
                                 CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  }
  Data::~Data((Data *)CONCAT17(in_stack_ffffffffffffffa7,
                               CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  return true;
}

Assistant:

bool AspifTextInput::parseStatements() {
	require(out_ != 0, "output not set");
	Data data;
	data_ = &data;
	for (char c; (c = peek(true)) != 0; data.clear()) {
		if      (c == '.') { match("."); }
		else if (c == '#') { if (!matchDirective()) break; }
		else if (c == '%') { skipLine(); }
		else               { matchRule(c); }
	}
	return true;
}